

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O2

void __thiscall de::cmdline::detail::Parser::Parser(Parser *this)

{
  value_type local_68;
  
  (this->m_options).
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_options).
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_options).
  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.shortName = "h";
  local_68.longName = "help";
  local_68.description = "Show this help";
  local_68.defaultValue = (char *)0x0;
  local_68.isFlag = true;
  local_68.parse = parseType<bool>;
  local_68.namedValues = (void *)0x0;
  local_68.namedValuesEnd = (void *)0x0;
  local_68.namedValueStride = 0x10;
  local_68.dispatchParse = dispatchParse<de::cmdline::(anonymous_namespace)::Help>;
  local_68.setDefault = dispatchSetDefault<de::cmdline::(anonymous_namespace)::Help>;
  std::
  vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
  ::push_back(&this->m_options,&local_68);
  return;
}

Assistant:

Parser::Parser (void)
{
	addOption(Option<Help>("h", "help", "Show this help"));
}